

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-xthread-test.c++
# Opt level: O0

Own<const_kj::Executor,_std::nullptr_t> kj::anon_unknown_0::makeDeadExecutor(void)

{
  Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> *maybe;
  Own<const_kj::Executor,_std::nullptr_t> *pOVar1;
  OwnOwn<const_kj::Executor,_std::nullptr_t> *pOVar2;
  Executor *extraout_RDX;
  Own<const_kj::Executor,_std::nullptr_t> *in_RDI;
  Own<const_kj::Executor,_std::nullptr_t> OVar3;
  Fault local_b8;
  undefined1 local_b0 [8];
  OwnOwn<const_kj::Executor,_std::nullptr_t> _kj_result;
  anon_class_16_2_aa8ff091 local_90;
  Type local_80;
  Function<void_()> local_78;
  undefined1 local_68 [8];
  Thread thread;
  undefined1 local_40 [8];
  Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> ownExecutor;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> executor;
  
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::MutexGuarded<>
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&ownExecutor.ptr.ptr);
  Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> *)local_40);
  local_80.executor = (MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&ownExecutor.ptr.ptr;
  Function<void()>::Function<kj::(anonymous_namespace)::makeDeadExecutor()::__0>
            ((Function<void()> *)&local_78,&local_80);
  Thread::Thread((Thread *)local_68,&local_78);
  Function<void_()>::~Function(&local_78);
  local_90.executor = (MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&ownExecutor.ptr.ptr;
  local_90.ownExecutor = (Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> *)local_40;
  makeDeadExecutor::anon_class_16_2_aa8ff091::operator()(&local_90);
  Thread::~Thread((Thread *)local_68);
  maybe = mv<kj::Maybe<kj::Own<kj::Executor_const,decltype(nullptr)>>>
                    ((Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> *)local_40);
  kj::_::readMaybe<kj::Executor_const,decltype(nullptr)>((_ *)local_b0,maybe);
  pOVar1 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_b0);
  if (pOVar1 != (Own<const_kj::Executor,_std::nullptr_t> *)0x0) {
    pOVar2 = mv<kj::_::OwnOwn<kj::Executor_const,decltype(nullptr)>>
                       ((OwnOwn<const_kj::Executor,_std::nullptr_t> *)local_b0);
    kj::_::OwnOwn<const_kj::Executor,_std::nullptr_t>::OwnOwn
              ((OwnOwn<const_kj::Executor,_std::nullptr_t> *)&_kj_result.value.ptr,pOVar2);
    kj::_::OwnOwn<const_kj::Executor,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::Executor,_std::nullptr_t> *)local_b0);
    pOVar1 = kj::_::OwnOwn<const_kj::Executor,_std::nullptr_t>::operator*
                       ((OwnOwn<const_kj::Executor,_std::nullptr_t> *)&_kj_result.value.ptr);
    Own<const_kj::Executor,_std::nullptr_t>::Own(in_RDI,pOVar1);
    kj::_::OwnOwn<const_kj::Executor,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::Executor,_std::nullptr_t> *)&_kj_result.value.ptr);
    Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> *)local_40);
    MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::~MutexGuarded
              ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&ownExecutor.ptr.ptr);
    OVar3.ptr = extraout_RDX;
    OVar3.disposer = (Disposer *)in_RDI;
    return OVar3;
  }
  kj::_::Debug::Fault::Fault
            (&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0x462,FAILED,"kj::mv(ownExecutor) != nullptr","");
  kj::_::Debug::Fault::fatal(&local_b8);
}

Assistant:

Own<const Executor> makeDeadExecutor() {
  MutexGuarded<Maybe<const Executor&>> executor;  // to get the Executor from the other thread

  // The other thread's executor, owned by the main thread.
  Maybe<Own<const Executor>> ownExecutor;

  {
    Thread thread([&]() noexcept {
      KJ_XTHREAD_TEST_SETUP_LOOP;

      auto lock = executor.lockExclusive();

      // Give our Executor to the main thread.
      *lock = getCurrentThreadExecutor();

      // Wait for the main thread to tell us it addRef-ed the Executor, then exit.
      lock.wait([&](const Maybe<const Executor&>& value) { return value == kj::none; });
    });

    ([&]() noexcept {
      auto lock = executor.lockExclusive();

      // Get the other thread's Executor.
      lock.wait([&](Maybe<const Executor&> value) { return value != kj::none; });
      ownExecutor = (KJ_ASSERT_NONNULL(*lock)).addRef();

      KJ_EXPECT(KJ_ASSERT_NONNULL(ownExecutor)->isLive());

      // Tell the other thread it can exit now.
      *lock = kj::none;
    })();
  }

  return KJ_ASSERT_NONNULL(kj::mv(ownExecutor));
}